

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrppm.c
# Opt level: O0

void copy_pixel_rows(j_decompress_ptr cinfo,djpeg_dest_ptr dinfo,JDIMENSION rows_supplied)

{
  long in_RSI;
  JSAMPROW ptr;
  char *bufferptr;
  ppm_dest_ptr dest;
  
  memcpy(*(void **)(in_RSI + 0x38),(void *)**(undefined8 **)(in_RSI + 0x28),
         (ulong)*(uint *)(in_RSI + 0x50));
  fwrite(*(void **)(in_RSI + 0x38),1,*(size_t *)(in_RSI + 0x48),*(FILE **)(in_RSI + 0x20));
  return;
}

Assistant:

METHODDEF(void)
copy_pixel_rows(j_decompress_ptr cinfo, djpeg_dest_ptr dinfo,
                JDIMENSION rows_supplied)
{
  ppm_dest_ptr dest = (ppm_dest_ptr)dinfo;
  register char *bufferptr;
  register JSAMPROW ptr;
#if BITS_IN_JSAMPLE != 8
  register JDIMENSION col;
#endif

  ptr = dest->pub.buffer[0];
  bufferptr = dest->iobuffer;
#if BITS_IN_JSAMPLE == 8
  MEMCOPY(bufferptr, ptr, dest->samples_per_row);
#else
  for (col = dest->samples_per_row; col > 0; col--) {
    PUTPPMSAMPLE(bufferptr, *ptr++);
  }
#endif
  (void)JFWRITE(dest->pub.output_file, dest->iobuffer, dest->buffer_width);
}